

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblock.c
# Opt level: O3

_Bool no_nonblock(int fd)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  stat sStack_a8;
  
  puVar3 = (undefined8 *)(ulong)(uint)fd;
  sStack_a8.__unused[2] = 0x165a4f;
  uVar1 = fcntl(fd,3);
  if ((int)uVar1 < 0) {
    sStack_a8.__unused[2] = 0x165a85;
    no_nonblock_cold_2();
  }
  else {
    sStack_a8.__unused[2] = 0x165a6b;
    iVar2 = fcntl(fd,4,(ulong)(uVar1 & 0x7ffff7ff));
    if (-1 < iVar2) {
      return (_Bool)((byte)(uVar1 >> 0xb) & 1);
    }
  }
  sStack_a8.__unused[2] = (long)open_for_write_would_lose_data;
  no_nonblock_cold_1();
  iVar2 = stat((char *)*puVar3,&sStack_a8);
  return -1 < iVar2 && (0 < sStack_a8.st_size && (sStack_a8.st_mode & 0xf000) == 0x8000);
}

Assistant:

bool no_nonblock(int fd)
{
    int fdflags;

    fdflags = fcntl(fd, F_GETFL);
    if (fdflags < 0) {
        fprintf(stderr, "%d: fcntl(F_GETFL): %s\n", fd, strerror(errno));
        exit(1);
    }
    if (fcntl(fd, F_SETFL, fdflags & ~O_NONBLOCK) < 0) {
        fprintf(stderr, "%d: fcntl(F_SETFL): %s\n", fd, strerror(errno));
        exit(1);
    }

    return fdflags & O_NONBLOCK;
}